

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::ArrayColumnData::GetColumnSegmentInfo
          (ArrayColumnData *this,idx_t row_group_index,vector<unsigned_long,_true> *col_path,
          vector<duckdb::ColumnSegmentInfo,_true> *result)

{
  reference pvVar1;
  pointer this_00;
  undefined8 in_RCX;
  undefined8 in_RSI;
  vector<duckdb::ColumnSegmentInfo,_true> *in_stack_00000388;
  vector<unsigned_long,_true> *in_stack_00000390;
  idx_t in_stack_00000398;
  ColumnData *in_stack_000003a0;
  vector<unsigned_long,_true> *in_stack_ffffffffffffff48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  vector<unsigned_long,_true> *this_01;
  undefined1 local_68 [40];
  vector<unsigned_long,_true> local_40;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  local_28 = 0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_ffffffffffffff50,(value_type_conflict1 *)in_stack_ffffffffffffff48);
  this_01 = &local_40;
  vector<unsigned_long,_true>::vector
            ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  ColumnData::GetColumnSegmentInfo
            (in_stack_000003a0,in_stack_00000398,in_stack_00000390,in_stack_00000388);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xb9f6d8);
  pvVar1 = vector<unsigned_long,_true>::back(this_01);
  *pvVar1 = 1;
  this_00 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
            operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                        *)in_stack_ffffffffffffff50);
  vector<unsigned_long,_true>::vector
            ((vector<unsigned_long,_true> *)this_00,in_stack_ffffffffffffff48);
  (*this_00->_vptr_ColumnData[0x21])(this_00,local_10,local_68,local_20);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xb9f74f);
  return;
}

Assistant:

void ArrayColumnData::GetColumnSegmentInfo(idx_t row_group_index, vector<idx_t> col_path,
                                           vector<ColumnSegmentInfo> &result) {
	col_path.push_back(0);
	validity.GetColumnSegmentInfo(row_group_index, col_path, result);
	col_path.back() = 1;
	child_column->GetColumnSegmentInfo(row_group_index, col_path, result);
}